

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

EGLConfig eglu::chooseConfigByID(Library *egl,EGLDisplay display,EGLint id)

{
  mapped_type_conflict mVar1;
  mapped_type_conflict *pmVar2;
  EGLConfig pvVar3;
  key_type_conflict local_74 [8];
  key_type_conflict local_54;
  undefined1 local_50 [8];
  AttribMap attribs;
  EGLint id_local;
  EGLDisplay display_local;
  Library *egl_local;
  
  attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = id;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_50)
  ;
  mVar1 = attribs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  local_54 = 0x3028;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_50,&local_54);
  *pmVar2 = mVar1;
  local_74[3] = 0x3034;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_50,local_74 + 3);
  *pmVar2 = -1;
  local_74[2] = 0x303f;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_50,local_74 + 2);
  *pmVar2 = -1;
  local_74[1] = 0x3040;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_50,local_74 + 1);
  *pmVar2 = -1;
  local_74[0] = 0x3033;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_50,local_74);
  *pmVar2 = -1;
  pvVar3 = chooseSingleConfig(egl,display,(AttribMap *)local_50);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_50)
  ;
  return pvVar3;
}

Assistant:

EGLConfig chooseConfigByID (const Library& egl, EGLDisplay display, EGLint id)
{
	AttribMap attribs;

	attribs[EGL_CONFIG_ID]			= id;
	attribs[EGL_TRANSPARENT_TYPE]	= EGL_DONT_CARE;
	attribs[EGL_COLOR_BUFFER_TYPE]	= EGL_DONT_CARE;
	attribs[EGL_RENDERABLE_TYPE]	= EGL_DONT_CARE;
	attribs[EGL_SURFACE_TYPE]		= EGL_DONT_CARE;

	return chooseSingleConfig(egl, display, attribs);
}